

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O1

int secp256k1_ec_commit_verify
              (secp256k1_ge *commitp,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,
              size_t data_size)

{
  int iVar1;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_ge local_f0;
  secp256k1_gej local_98;
  
  iVar1 = secp256k1_ec_commit(&local_f0,pubp,sha,data,data_size);
  if (iVar1 == 0) {
    local_98.infinity = 0;
  }
  else {
    secp256k1_ge_neg(&local_f0,&local_f0);
    local_98.infinity = local_f0.infinity;
    local_98.x.n[0] = local_f0.x.n[0];
    local_98.x.n[1] = local_f0.x.n[1];
    local_98.x.n[2] = local_f0.x.n[2];
    local_98.x.n[3] = local_f0.x.n[3];
    local_98.x.n[4] = local_f0.x.n[4];
    local_98.y.n[0] = local_f0.y.n[0];
    local_98.y.n[1] = local_f0.y.n[1];
    local_98.y.n[2] = local_f0.y.n[2];
    local_98.y.n[3] = local_f0.y.n[3];
    local_98.y.n[4] = local_f0.y.n[4];
    local_98.z.n[0] = 1;
    local_98.z.n[1] = 0;
    local_98.z.n[2] = 0;
    local_98.z.n[3] = 0;
    local_98.z.n[4] = 0;
    secp256k1_gej_add_ge_var(&local_98,&local_98,commitp,(secp256k1_fe *)0x0);
  }
  return local_98.infinity;
}

Assistant:

static int secp256k1_ec_commit_verify(const secp256k1_ge* commitp, const secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size) {
    secp256k1_gej pj;
    secp256k1_ge p;

    if (!secp256k1_ec_commit(&p, pubp, sha, data, data_size)) {
        return 0;
    }

    /* Return p == commitp */
    secp256k1_ge_neg(&p, &p);
    secp256k1_gej_set_ge(&pj, &p);
    secp256k1_gej_add_ge_var(&pj, &pj, commitp, NULL);
    return secp256k1_gej_is_infinity(&pj);
}